

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int OptNArgs(void)

{
  char cVar1;
  char *__s;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  char **ppcVar5;
  
  iVar4 = 0;
  if ((argv != (char **)0x0) && (iVar4 = 0, *argv != (char *)0x0)) {
    iVar4 = 0;
    ppcVar5 = argv;
    bVar2 = false;
    while( true ) {
      ppcVar5 = ppcVar5 + 1;
      __s = *ppcVar5;
      if (__s == (char *)0x0) break;
      cVar1 = *__s;
      if ((bVar2) ||
         (((cVar1 != '+' && (cVar1 != '-')) && (pcVar3 = strchr(__s,0x3d), pcVar3 == (char *)0x0))))
      {
        iVar4 = iVar4 + 1;
      }
      if (((cVar1 == '-') && (__s[1] == '-')) && (__s[2] == '\0')) {
        bVar2 = true;
      }
    }
  }
  return iVar4;
}

Assistant:

int OptNArgs(){
  int cnt = 0;
  int dashdash = 0;
  int i;
  if( argv!=0 && argv[0]!=0 ){
    for(i=1; argv[i]; i++){
      if( dashdash || !ISOPT(argv[i]) ) cnt++;
      if( strcmp(argv[i],"--")==0 ) dashdash = 1;
    }
  }
  return cnt;
}